

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

void __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
::compute_strides<boost::array<long,2ul>,boost::array<unsigned_long,2ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
           *this,array<long,_2UL> *stride_list,array<unsigned_long,_2UL> *extent_list,
          general_storage_order<2UL> *storage)

{
  bool bVar1;
  size_type sVar2;
  reference plVar3;
  reference puVar4;
  array<unsigned_long,_2UL> *in_RDX;
  array<long,_2UL> *in_RSI;
  index stride_sign;
  size_type n;
  index stride;
  array<long,_2UL> *in_stack_ffffffffffffffa8;
  general_storage_order<2UL> *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 1;
  for (local_30 = 0; local_30 != 2; local_30 = local_30 + 1) {
    local_38 = 1;
    general_storage_order<2UL>::ordering
              (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    bVar1 = general_storage_order<2UL>::ascending
                      (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      local_38 = -1;
    }
    in_stack_ffffffffffffffb0 = (general_storage_order<2UL> *)(local_28 * local_38);
    in_stack_ffffffffffffffa8 = in_RSI;
    sVar2 = general_storage_order<2UL>::ordering(in_stack_ffffffffffffffb0,(size_type)in_RSI);
    plVar3 = array<long,_2UL>::operator[](in_stack_ffffffffffffffa8,sVar2);
    *plVar3 = (long)in_stack_ffffffffffffffb0;
    sVar2 = general_storage_order<2UL>::ordering
                      (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    puVar4 = array<unsigned_long,_2UL>::operator[](in_RDX,sVar2);
    local_28 = *puVar4 * local_28;
  }
  return;
}

Assistant:

void compute_strides(StrideList& stride_list, ExtentList& extent_list,
                       const general_storage_order<NumDims>& storage)
  {
    // invariant: stride = the stride for dimension n
    index stride = 1;
    for (size_type n = 0; n != NumDims; ++n) {
      index stride_sign = +1;
      
      if (!storage.ascending(storage.ordering(n)))
        stride_sign = -1;
      
      // The stride for this dimension is the product of the
      // lengths of the ranks minor to it.
      stride_list[storage.ordering(n)] = stride * stride_sign;
      
      stride *= extent_list[storage.ordering(n)];
    } 
  }